

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O0

void __thiscall
yactfr::internal::JsonSlStrTypeValReq::_validate(JsonSlStrTypeValReq *this,JsonVal *jsonVal)

{
  TextParseError *exc;
  JsonVal *jsonVal_local;
  JsonSlStrTypeValReq *this_local;
  
  JsonObjValReq::_validate((JsonObjValReq *)this,jsonVal);
  return;
}

Assistant:

void _validate(const JsonVal& jsonVal) const override
    {
        try {
            JsonStrTypeValReq::_validate(jsonVal);
        } catch (TextParseError& exc) {
            appendMsgToTextParseError(exc, "Invalid static-length string type:", jsonVal.loc());
            throw;
        }
    }